

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

size_t __thiscall
frozen::bits::pmh_tables<4ul,frozen::elsa<unsigned_int>>::lookup<int,frozen::elsa<unsigned_int>>
          (pmh_tables<4ul,frozen::elsa<unsigned_int>> *this,int *key,elsa<unsigned_int> *hasher)

{
  size_t sVar1;
  uint local_20;
  uint local_1c;
  
  local_1c = *key;
  sVar1 = elsa<unsigned_int>::operator()(hasher,&local_1c,*(size_t *)this);
  sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 3) * 8 + 8);
  if ((long)sVar1 < 0) {
    local_20 = *key;
    sVar1 = elsa<unsigned_int>::operator()(hasher,&local_20,sVar1);
    sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 3) * 8 + 0x28);
  }
  return sVar1;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }